

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O0

void __thiscall Chip8::OP_CXKK(Chip8 *this)

{
  ostream *poVar1;
  Chip8 *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"RND V");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->opcode & 0xf00) >> 8);
  poVar1 = std::operator<<(poVar1,", 0x00");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->opcode & 0xff);
  poVar1 = std::operator<<(poVar1,"              ; Set Vx = random byte AND kk");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Chip8::OP_CXKK() {
    std::cout << "RND V"<<((opcode & 0x0F00u) >> 8u) << ", 0x00"<<((opcode & 0x00FFu))<< "              ; Set Vx = random byte AND kk" << std::endl;
}